

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeDensityZ.cpp
# Opt level: O0

void __thiscall OpenMD::ChargeDensityZ::generateXYZForLastFrame(ChargeDensityZ *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  byte bVar8;
  bool bVar9;
  __type_conflict _Var10;
  char *pcVar11;
  size_type sVar12;
  ostream *poVar13;
  double *pdVar14;
  pointer ppVar15;
  reference pvVar16;
  mapped_type_conflict *pmVar17;
  mapped_type *pmVar18;
  size_type sVar19;
  size_type sVar20;
  long lVar21;
  undefined8 uVar22;
  long in_RDI;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  RealType gaussian_scale;
  RealType chargeDiff;
  RealType charge_for_atom;
  RealType r2;
  RealType y_pos;
  RealType x_pos;
  RealType z_pos;
  RealType zt;
  RealType yt;
  RealType xt;
  size_t index;
  RealType averageCharge;
  RealType v_radius2;
  RealType v_radius;
  string a_name1;
  int key1;
  iterator it1;
  RealType charge;
  RealType z;
  RealType y;
  RealType x;
  string a_name;
  int key;
  iterator it;
  int nAtoms;
  ofstream rdfStream;
  string XYZFile;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffaa8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffab0;
  errorStruct *peVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  ostream *in_stack_fffffffffffffae8;
  ostream *in_stack_fffffffffffffaf0;
  double local_4e8;
  ulong local_310;
  string local_2f0 [36];
  int local_2cc;
  _Self local_2c8;
  _Self local_2c0;
  double local_2b8;
  value_type local_2b0;
  value_type local_2a8;
  value_type local_2a0;
  string local_298 [36];
  int local_274;
  _Self local_270;
  _Self local_268;
  int local_25c;
  ostream local_258 [528];
  string local_48 [32];
  string local_28 [40];
  
  getPrefix(in_stack_fffffffffffffab8);
  std::operator+(in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0);
  std::__cxx11::string::~string(local_48);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_258,pcVar11,_S_out);
  sVar12 = std::
           map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
           ::size((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                   *)0x204a0e);
  local_25c = (int)sVar12;
  bVar8 = std::ofstream::is_open();
  if ((bVar8 & 1) == 0) {
    uVar22 = std::__cxx11::string::c_str();
    peVar26 = &painCave;
    snprintf(painCave.errMsg,2000,"XYZ file: unable to open %s\n",uVar22);
    peVar26->isFatal = 1;
    simError();
  }
  else {
    poVar13 = (ostream *)std::ostream::operator<<(local_258,local_25c);
    std::operator<<(poVar13,"\n");
    poVar13 = (ostream *)std::ostream::operator<<(local_258,1);
    poVar13 = std::operator<<(poVar13,";\t");
    pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                        ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x838),*(uint *)(in_RDI + 0x7dc),
                         *(uint *)(in_RDI + 0x7dc));
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar14);
    poVar13 = std::operator<<(poVar13,"\t");
    pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                        ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x838),*(uint *)(in_RDI + 0x7dc),
                         *(uint *)(in_RDI + 0x7e0));
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar14);
    poVar13 = std::operator<<(poVar13,"\t");
    pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                        ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x838),*(uint *)(in_RDI + 0x7dc),
                         *(uint *)(in_RDI + 0x7d8));
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar14);
    poVar13 = std::operator<<(poVar13,"\t");
    pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                        ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x838),*(uint *)(in_RDI + 0x7e0),
                         *(uint *)(in_RDI + 0x7dc));
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar14);
    poVar13 = std::operator<<(poVar13,"\t");
    pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                        ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x838),*(uint *)(in_RDI + 0x7e0),
                         *(uint *)(in_RDI + 0x7e0));
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar14);
    poVar13 = std::operator<<(poVar13,"\t");
    pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                        ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x838),*(uint *)(in_RDI + 0x7e0),
                         *(uint *)(in_RDI + 0x7d8));
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar14);
    poVar13 = std::operator<<(poVar13,"\t");
    pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                        ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x838),*(uint *)(in_RDI + 0x7d8),
                         *(uint *)(in_RDI + 0x7dc));
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar14);
    poVar13 = std::operator<<(poVar13,"\t");
    pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                        ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x838),*(uint *)(in_RDI + 0x7d8),
                         *(uint *)(in_RDI + 0x7e0));
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar14);
    poVar13 = std::operator<<(poVar13,"\t");
    pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                        ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x838),*(uint *)(in_RDI + 0x7d8),
                         *(uint *)(in_RDI + 0x7d8));
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar14);
    std::operator<<(poVar13,"\n");
    local_268._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(in_stack_fffffffffffffaa8);
    while( true ) {
      local_270._M_node =
           (_Base_ptr)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(in_stack_fffffffffffffaa8);
      bVar9 = std::operator!=(&local_268,&local_270);
      if (!bVar9) break;
      ppVar15 = std::
                _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x204ede);
      local_274 = ppVar15->first;
      ppVar15 = std::
                _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x204ef4);
      std::__cxx11::string::string(local_298,(string *)&ppVar15->second);
      std::
      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    *)in_stack_fffffffffffffaf0,(key_type *)in_stack_fffffffffffffae8);
      pvVar16 = std::vector<double,_std::allocator<double>_>::back(in_stack_fffffffffffffab0);
      local_2a0 = *pvVar16;
      std::
      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    *)in_stack_fffffffffffffaf0,(key_type *)in_stack_fffffffffffffae8);
      pvVar16 = std::vector<double,_std::allocator<double>_>::back(in_stack_fffffffffffffab0);
      local_2a8 = *pvVar16;
      std::
      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    *)in_stack_fffffffffffffaf0,(key_type *)in_stack_fffffffffffffae8);
      pvVar16 = std::vector<double,_std::allocator<double>_>::back(in_stack_fffffffffffffab0);
      local_2b0 = *pvVar16;
      local_2b8 = 0.0;
      _Var10 = std::operator==(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      if (_Var10) {
        local_2c0._M_node =
             (_Base_ptr)
             std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(in_stack_fffffffffffffaa8);
        while( true ) {
          local_2c8._M_node =
               (_Base_ptr)
               std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(in_stack_fffffffffffffaa8);
          bVar9 = std::operator!=(&local_2c0,&local_2c8);
          if (!bVar9) break;
          ppVar15 = std::
                    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)0x205066);
          local_2cc = ppVar15->first;
          ppVar15 = std::
                    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)0x20507c);
          std::__cxx11::string::string(local_2f0,(string *)&ppVar15->second);
          pmVar17 = std::
                    map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                  *)in_stack_fffffffffffffaf0,(key_type *)in_stack_fffffffffffffae8)
          ;
          dVar1 = *pmVar17;
          pmVar17 = std::
                    map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                  *)in_stack_fffffffffffffaf0,(key_type *)in_stack_fffffffffffffae8)
          ;
          dVar2 = *pmVar17;
          local_310 = 0;
          while( true ) {
            pmVar18 = std::
                      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                    *)in_stack_fffffffffffffaf0,
                                   (key_type *)in_stack_fffffffffffffae8);
            sVar19 = std::vector<double,_std::allocator<double>_>::size(pmVar18);
            if (sVar19 <= local_310) break;
            pmVar18 = std::
                      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                    *)in_stack_fffffffffffffaf0,
                                   (key_type *)in_stack_fffffffffffffae8);
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](pmVar18,local_310);
            dVar23 = *pvVar16;
            pmVar18 = std::
                      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                    *)in_stack_fffffffffffffaf0,
                                   (key_type *)in_stack_fffffffffffffae8);
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](pmVar18,local_310);
            dVar24 = *pvVar16;
            pmVar18 = std::
                      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                    *)in_stack_fffffffffffffaf0,
                                   (key_type *)in_stack_fffffffffffffae8);
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](pmVar18,local_310);
            dVar3 = *pvVar16;
            pmVar18 = std::
                      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                    *)in_stack_fffffffffffffaf0,
                                   (key_type *)in_stack_fffffffffffffae8);
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](pmVar18,local_310);
            dVar4 = *pvVar16;
            pmVar18 = std::
                      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                    *)in_stack_fffffffffffffaf0,
                                   (key_type *)in_stack_fffffffffffffae8);
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](pmVar18,local_310);
            dVar5 = *pvVar16;
            pmVar18 = std::
                      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                    *)in_stack_fffffffffffffaf0,
                                   (key_type *)in_stack_fffffffffffffae8);
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](pmVar18,local_310);
            dVar6 = *pvVar16;
            pmVar18 = std::
                      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                    *)in_stack_fffffffffffffaf0,
                                   (key_type *)in_stack_fffffffffffffae8);
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](pmVar18,local_310);
            if (ABS(*pvVar16 - dVar2) <= 1e-06) {
              local_4e8 = 0.0;
            }
            else {
              local_4e8 = *pvVar16 - dVar2;
            }
            dVar23 = exp(-((dVar3 - dVar4) * (dVar3 - dVar4) +
                          (dVar23 - dVar5) * (dVar23 - dVar5) + (dVar24 - dVar6) * (dVar24 - dVar6))
                         / (dVar1 * dVar1 * 2.0));
            dVar24 = sqrt(dVar1 * 6.283185307179586 * dVar1);
            local_2b8 = local_4e8 * (dVar23 / dVar24) + local_2b8;
            local_310 = local_310 + 1;
          }
          std::__cxx11::string::~string(local_2f0);
          std::
          _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffab0);
        }
        iVar7 = *(int *)(in_RDI + 0xd0);
        sVar20 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::size((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)0x2055c1);
        lVar21 = (long)iVar7 * sVar20;
        auVar25._8_4_ = (int)((ulong)lVar21 >> 0x20);
        auVar25._0_8_ = lVar21;
        auVar25._12_4_ = 0x45300000;
        local_2b8 = local_2b8 /
                    ((auVar25._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0));
      }
      else {
        std::
        map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                      *)in_stack_fffffffffffffaf0,(key_type *)in_stack_fffffffffffffae8);
        pvVar16 = std::vector<double,_std::allocator<double>_>::back(in_stack_fffffffffffffab0);
        local_2b8 = *pvVar16;
      }
      poVar13 = std::operator<<(local_258,local_298);
      in_stack_fffffffffffffaf0 = std::operator<<(poVar13,"\t");
      in_stack_fffffffffffffae8 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffaf0,local_2a0);
      poVar13 = std::operator<<(in_stack_fffffffffffffae8,"\t");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_2a8);
      in_stack_fffffffffffffad0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(poVar13,"\t");
      in_stack_fffffffffffffac8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::ostream::operator<<(in_stack_fffffffffffffad0,local_2b0);
      poVar13 = std::operator<<((ostream *)in_stack_fffffffffffffac8,"\t");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_2b8);
      std::operator<<(poVar13,"\n");
      std::__cxx11::string::~string(local_298);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffab0);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_258);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void ChargeDensityZ::generateXYZForLastFrame() {
    std::string XYZFile(getPrefix(fileName_) + ".xyz");
    std::ofstream rdfStream(XYZFile.c_str());
    int nAtoms = zPosUsingGlobalIndex_.size();

    if (rdfStream.is_open()) {
      rdfStream << nAtoms << "\n";
      rdfStream << 1 << ";\t" << hmat_(x_, x_) << "\t" << hmat_(x_, y_) << "\t"
                << hmat_(x_, axis_) << "\t" << hmat_(y_, x_) << "\t"
                << hmat_(y_, y_) << "\t" << hmat_(y_, axis_) << "\t"
                << hmat_(axis_, x_) << "\t" << hmat_(axis_, y_) << "\t"
                << hmat_(axis_, axis_) << "\n";

      for (std::map<int, std::string>::iterator it =
               atomNameGlobalIndex_.begin();
           it != atomNameGlobalIndex_.end(); ++it) {
        int key            = it->first;
        std::string a_name = it->second;
        RealType x         = zPosUsingGlobalIndex_[key].back();
        RealType y         = xPosUsingGlobalIndex_[key].back();
        RealType z         = yPosUsingGlobalIndex_[key].back();
        RealType charge    = 0;

        if (a_name == atomFlucCharge_) {
          for (std::map<int, std::string>::iterator it1 =
                   atomNameGlobalIndex_.begin();
               it1 != atomNameGlobalIndex_.end(); ++it1) {
            int key1            = it1->first;
            std::string a_name1 = it1->second;

            RealType v_radius      = vanderRUsingGlobalIndex_[key1];
            RealType v_radius2     = v_radius * v_radius;
            RealType averageCharge = averageChargeUsingGlobalIndex_[key1];

            for (size_t index = 0; index < zPosUsingGlobalIndex_[key1].size();
                 ++index) {
              RealType xt = xPosUsingGlobalIndex_[key][index];
              RealType yt = yPosUsingGlobalIndex_[key][index];
              RealType zt = zPosUsingGlobalIndex_[key][index];

              RealType z_pos = zPosUsingGlobalIndex_[key1][index];
              RealType x_pos = xPosUsingGlobalIndex_[key1][index];
              RealType y_pos = yPosUsingGlobalIndex_[key1][index];
              RealType r2    = (xt - x_pos) * (xt - x_pos) +
                            (yt - y_pos) * (yt - y_pos) +
                            (zt - z_pos) * (zt - z_pos);

              RealType charge_for_atom =
                  totalChargeUsingGlobalIndex_[key1][index];
              RealType chargeDiff =
                  fabs(charge_for_atom - averageCharge) > epsilon ?
                      charge_for_atom - averageCharge :
                      0;
              RealType gaussian_scale =
                  exp(-r2 / (v_radius2 * 2.0)) /
                  (sqrt(2 * Constants::PI * v_radius * v_radius));
              //  RealType gaussian_scale = 2 * (r2 /( v_radius2 * v_radius)) *
              //  exp(-r2/(v_radius2*2.0)) / (sqrt(2*Constants::PI)* v_radius2 *
              //  v_radius);
              charge += chargeDiff * gaussian_scale;
            }
          }
          charge /= (nProcessed_ * atomNameGlobalIndex_.size());

        } else {
          charge = totalChargeUsingGlobalIndex_[key].back();
        }

        rdfStream << a_name << "\t" << x << "\t" << y << "\t" << z << "\t"
                  << charge << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "XYZ file: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }